

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

StringEnumeration * __thiscall icu_63::Locale::createKeywords(Locale *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t keywordLen;
  char *pcVar2;
  char *pcVar3;
  KeywordEnumeration *this_00;
  size_t size;
  KeywordEnumeration *local_180;
  int32_t keyLen;
  char *assignment;
  char *variantStart;
  StringEnumeration *result;
  char local_128 [4];
  int32_t keywordCapacity;
  char keywords [256];
  UErrorCode *status_local;
  Locale *this_local;
  
  variantStart = (char *)0x0;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pcVar2 = strchr(this->fullName,0x40);
    pcVar3 = strchr(this->fullName,0x3d);
    if (pcVar2 != (char *)0x0) {
      if (pcVar2 < pcVar3) {
        size = 0x40;
        keywordLen = locale_getKeywords_63
                               (pcVar2 + 1,'@',local_128,0x100,(char *)0x0,0,(int32_t *)0x0,'\0',
                                status);
        UVar1 = ::U_SUCCESS(*status);
        if ((UVar1 != '\0') && (keywordLen != 0)) {
          this_00 = (KeywordEnumeration *)UMemory::operator_new((UMemory *)0xd0,size);
          local_180 = (KeywordEnumeration *)0x0;
          if (this_00 != (KeywordEnumeration *)0x0) {
            KeywordEnumeration::KeywordEnumeration(this_00,local_128,keywordLen,0,status);
            local_180 = this_00;
          }
          variantStart = (char *)local_180;
          if (local_180 == (KeywordEnumeration *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
          }
        }
      }
      else {
        *status = U_INVALID_FORMAT_ERROR;
      }
    }
    this_local = (Locale *)variantStart;
  }
  else {
    this_local = (Locale *)0x0;
  }
  return (StringEnumeration *)this_local;
}

Assistant:

StringEnumeration *
Locale::createKeywords(UErrorCode &status) const
{
    char keywords[256];
    int32_t keywordCapacity = sizeof keywords;
    StringEnumeration *result = NULL;

    if (U_FAILURE(status)) {
        return result;
    }

    const char* variantStart = uprv_strchr(fullName, '@');
    const char* assignment = uprv_strchr(fullName, '=');
    if(variantStart) {
        if(assignment > variantStart) {
            int32_t keyLen = locale_getKeywords(variantStart+1, '@', keywords, keywordCapacity, NULL, 0, NULL, FALSE, &status);
            if(U_SUCCESS(status) && keyLen) {
                result = new KeywordEnumeration(keywords, keyLen, 0, status);
                if (!result) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                }
            }
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    return result;
}